

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_local.hpp
# Opt level: O1

void __thiscall
openjij::test::PolySystemKLP_ConstructorGraphSparseInt2_Test::TestBody
          (PolySystemKLP_ConstructorGraphSparseInt2_Test *this)

{
  string local_68;
  _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_48;
  
  GeneratePolynomialInteractionsSparseInt2<double>();
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Sparse","");
  TestKLPConstructorGraph<unsigned_long,double>
            ((Polynomial<unsigned_long,_double> *)&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::
  _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_48);
  return;
}

Assistant:

TEST(PolySystemKLP, ConstructorGraphSparseInt2) {
   TestKLPConstructorGraph<openjij::graph::Index, double>(GeneratePolynomialInteractionsSparseInt2<double>(), "Sparse");
}